

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_tri_metric_area(REF_NODE ref_node,REF_INT *nodes,REF_DBL *area)

{
  int iVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  REF_DBL det;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog2 [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  double local_120;
  REF_DBL local_118 [6];
  REF_DBL local_e8 [6];
  double dStack_b8;
  REF_DBL local_b0 [5];
  double dStack_88;
  REF_DBL local_80 [5];
  double dStack_58;
  REF_DBL local_50 [6];
  
  uVar3 = ref_node_tri_area(ref_node,nodes,area);
  if (uVar3 == 0) {
    iVar1 = *nodes;
    pRVar2 = ref_node->real;
    lVar5 = 0;
    do {
      local_50[lVar5 + -1] = pRVar2[iVar1 * 0xf + 9 + (int)lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    iVar1 = nodes[1];
    lVar5 = 0;
    do {
      local_80[lVar5 + -1] = pRVar2[iVar1 * 0xf + 9 + (int)lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    iVar1 = nodes[2];
    lVar5 = 0;
    do {
      local_b0[lVar5 + -1] = pRVar2[iVar1 * 0xf + 9 + (int)lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    lVar5 = 0;
    do {
      auVar7._0_8_ = local_50[lVar5 + -1] + local_80[lVar5 + -1] + local_b0[lVar5 + -1];
      auVar7._8_8_ = local_50[lVar5] + local_80[lVar5] + local_b0[lVar5];
      auVar7 = divpd(auVar7,_DAT_002000a0);
      *(undefined1 (*) [16])(local_e8 + lVar5) = auVar7;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 6);
    uVar3 = ref_matrix_exp_m(local_e8,local_118);
    if (uVar3 == 0) {
      uVar3 = ref_matrix_det_m(local_118,&local_120);
      if (uVar3 == 0) {
        if (local_120 < 0.0) {
          local_120 = sqrt(local_120);
        }
        else {
          local_120 = SQRT(local_120);
        }
        *area = local_120 * *area * 2.3094010767585034;
        return 0;
      }
      pcVar6 = "det(mavg)";
      uVar4 = 0x938;
    }
    else {
      pcVar6 = "exp";
      uVar4 = 0x937;
    }
  }
  else {
    pcVar6 = "tri area";
    uVar4 = 0x932;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
         "ref_node_tri_metric_area",(ulong)uVar3,pcVar6);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_metric_area(REF_NODE ref_node, REF_INT *nodes,
                                            REF_DBL *area) {
  REF_DBL mlog0[6], mlog1[6], mlog2[6];
  REF_DBL mlog[6], m[6], det;
  REF_INT i;

  RSS(ref_node_tri_area(ref_node, nodes, area), "tri area");
  RSS(ref_node_metric_get_log(ref_node, nodes[0], mlog0), "log0");
  RSS(ref_node_metric_get_log(ref_node, nodes[1], mlog1), "log1");
  RSS(ref_node_metric_get_log(ref_node, nodes[2], mlog2), "log2");
  for (i = 0; i < 6; i++) mlog[i] = (mlog0[i] + mlog1[i] + mlog2[i]) / 3.0;
  RSS(ref_matrix_exp_m(mlog, m), "exp");
  RSS(ref_matrix_det_m(m, &det), "det(mavg)");
  (*area) *= sqrt(det);
  (*area) *= 4.0 / sqrt(3.0);

  return REF_SUCCESS;
}